

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O0

void __thiscall simplifyRational_rational2_Test::TestBody(simplifyRational_rational2_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lhs;
  bool bVar1;
  char *message;
  ExprPtr EVar2;
  AssertHelper local_80;
  Message local_78 [3];
  shared_ptr<const_mathiu::impl::Expr> local_60;
  string local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  ExprPtr f3o2;
  simplifyRational_rational2_Test *this_local;
  
  lhs = &gtest_ar.message_;
  mathiu::impl::fraction((Integer)lhs,3);
  EVar2 = mathiu::impl::operator+((impl *)&local_60,(ExprPtr *)lhs,(ExprPtr *)lhs);
  mathiu::impl::toString_abi_cxx11_
            (&local_50,(impl *)&local_60,
             (ExprPtr *)
             EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_30,"toString(f3o2 + f3o2)","\"3\"",&local_50,(char (*) [2])0x3bac11);
  std::__cxx11::string::~string((string *)&local_50);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x71,message);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(simplifyRational, rational2)
{
    auto const f3o2 = fraction(3, 2);

    EXPECT_EQ(toString(f3o2 + f3o2), "3");
}